

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_line_container_test.cpp
# Opt level: O0

void queryTest(int absBound)

{
  bool bVar1;
  reference __x;
  ll lhs;
  ll rhs;
  char *message;
  AssertHelper local_b8;
  Message local_b0;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar;
  int x;
  int qit;
  Line *l;
  iterator __end1;
  iterator __begin1;
  vector<Line,_std::allocator<Line>_> *__range1;
  vector<Line,_std::allocator<Line>_> lines;
  undefined1 local_48 [8];
  vector<Line,_std::allocator<Line>_> linesToAdd;
  LineContainer lc;
  int absBound_local;
  
  LineContainer::LineContainer
            ((LineContainer *)
             &linesToAdd.super__Vector_base<Line,_std::allocator<Line>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  genLines((vector<Line,_std::allocator<Line>_> *)local_48,100,-absBound,absBound,-absBound,absBound
          );
  std::vector<Line,_std::allocator<Line>_>::vector((vector<Line,_std::allocator<Line>_> *)&__range1)
  ;
  sortLines((vector<Line,_std::allocator<Line>_> *)local_48);
  __end1 = std::vector<Line,_std::allocator<Line>_>::begin
                     ((vector<Line,_std::allocator<Line>_> *)local_48);
  l = (Line *)std::vector<Line,_std::allocator<Line>_>::end
                        ((vector<Line,_std::allocator<Line>_> *)local_48);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Line_*,_std::vector<Line,_std::allocator<Line>_>_>
                                     *)&l), bVar1) {
    __x = __gnu_cxx::__normal_iterator<Line_*,_std::vector<Line,_std::allocator<Line>_>_>::operator*
                    (&__end1);
    std::vector<Line,_std::allocator<Line>_>::push_back
              ((vector<Line,_std::allocator<Line>_> *)&__range1,__x);
    LineContainer::add((LineContainer *)
                       &linesToAdd.super__Vector_base<Line,_std::allocator<Line>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,__x->k,__x->m);
    for (gtest_ar.message_.ptr_._4_4_ = 0; gtest_ar.message_.ptr_._4_4_ < 10;
        gtest_ar.message_.ptr_._4_4_ = gtest_ar.message_.ptr_._4_4_ + 1) {
      gtest_ar.message_.ptr_._0_4_ = randrange(-1000,1000);
      lhs = naiveQuery((vector<Line,_std::allocator<Line>_> *)&__range1,
                       (long)(int)gtest_ar.message_.ptr_);
      rhs = LineContainer::query
                      ((LineContainer *)
                       &linesToAdd.super__Vector_base<Line,_std::allocator<Line>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,(long)(int)gtest_ar.message_.ptr_)
      ;
      testing::internal::EqHelper<false>::Compare
                ((EqHelper<false> *)local_a8,"naiveQuery(lines, x)","lc.query(x)",lhs,rhs);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
      if (!bVar1) {
        testing::Message::Message(&local_b0);
        message = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
        testing::internal::AssertHelper::AssertHelper
                  (&local_b8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/trinerdi[P]icpc-notebook/src/trinerdi/data-structures/fast_line_container_test.cpp"
                   ,0x2a,message);
        testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
        testing::internal::AssertHelper::~AssertHelper(&local_b8);
        testing::Message::~Message(&local_b0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
    }
    __gnu_cxx::__normal_iterator<Line_*,_std::vector<Line,_std::allocator<Line>_>_>::operator++
              (&__end1);
  }
  std::vector<Line,_std::allocator<Line>_>::~vector
            ((vector<Line,_std::allocator<Line>_> *)&__range1);
  std::vector<Line,_std::allocator<Line>_>::~vector((vector<Line,_std::allocator<Line>_> *)local_48)
  ;
  LineContainer::~LineContainer
            ((LineContainer *)
             &linesToAdd.super__Vector_base<Line,_std::allocator<Line>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void queryTest(int absBound) {
    LineContainer lc;
    vector<Line> linesToAdd = genLines(100, -absBound,absBound,-absBound,absBound),
                 lines;
    
    sortLines(linesToAdd);
    for(auto & l : linesToAdd) {
        lines.push_back(l);
        lc.add(l.k, l.m);
        rep(qit, 0, 10) {
            int x = randrange(-1000, 1000);
            EXPECT_EQ(naiveQuery(lines, x), lc.query(x));
        }
    }
}